

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cc
# Opt level: O2

int video_to_image(char *video_name,char *dir_name)

{
  char cVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  int __val;
  string img_path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  char *local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  VideoCapture cap;
  string local_b0;
  Mat img;
  
  local_108 = dir_name;
  cv::Mat::Mat(&img);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&img_path,video_name,(allocator<char> *)&local_100);
  cv::VideoCapture::VideoCapture(&cap,(string *)&img_path,0);
  std::__cxx11::string::~string((string *)&img_path);
  cVar1 = cv::VideoCapture::isOpened();
  if (cVar1 == '\0') {
    perror("Open video file failed!\n");
  }
  bVar2 = 1;
  iVar3 = 0;
  __val = 0;
  uVar4 = 0;
  while( true ) {
    if ((bVar2 & 1) == 0) break;
    img_path.field_2._M_allocated_capacity = 0;
    img_path._M_dataplus._M_p._0_4_ = 0x2010000;
    img_path._M_string_length = (size_type)&img;
    cv::VideoCapture::read((_OutputArray *)&cap);
    bVar2 = cv::Mat::empty();
    if ((uVar4 / 0x14) * 0x14 + iVar3 == 0) {
      std::operator+(&local_128,local_108,&forward_slash_abi_cxx11_);
      __val = __val + 1;
      std::__cxx11::to_string(&local_b0,__val);
      std::operator+(&local_100,&local_128,&local_b0);
      std::operator+(&img_path,&local_100,&suffix_png_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_128);
      local_100.field_2._M_allocated_capacity = 0;
      local_100._M_dataplus._M_p._0_4_ = 0x1010000;
      local_100._M_string_length = (size_type)&img;
      local_128._M_dataplus._M_p = (pointer)0x0;
      local_128._M_string_length = 0;
      local_128.field_2._M_allocated_capacity = 0;
      cv::imwrite((string *)&img_path,(_InputArray *)&local_100,(vector *)&local_128);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&local_128);
      std::__cxx11::string::~string((string *)&img_path);
    }
    bVar2 = bVar2 ^ 1;
    uVar4 = uVar4 + 1;
    iVar3 = iVar3 + -1;
  }
  cv::VideoCapture::release();
  cv::VideoCapture::~VideoCapture(&cap);
  cv::Mat::~Mat(&img);
  return 0;
}

Assistant:

int video_to_image(const char *video_name, const char *dir_name) {
  int frame_cnt = 0;
  int num = 0;
  Mat img;

  VideoCapture cap(video_name);
  if (!cap.isOpened()) perror("Open video file failed!\n");

  bool flag = true;
  while (flag) {
    bool success = cap.read(img);
    if (img.empty()) flag = false;

    if (frame_cnt % 20 == 0) {
      ++num;
      string img_path = dir_name + forward_slash + to_string(num) + suffix_png;
      imwrite(img_path, img);
    }
    ++frame_cnt;
  }
  cap.release();
  return 0;
}